

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall ON_DimStyle::Write(ON_DimStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  V5_TextDisplayMode VVar2;
  LengthUnitSystem model_unit_system;
  LengthUnitSystem model_unit_system_00;
  OBSOLETE_length_format OVar3;
  MaskType MVar4;
  V5_vertical_alignment VVar5;
  V5_horizontal_alignment VVar6;
  LengthUnitSystem LVar7;
  LengthDisplay LVar8;
  int iVar9;
  field field_id;
  ON_UUID *uuid;
  bool b;
  double x;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_74;
  V5_horizontal_alignment obsolete_leader_halign;
  V5_horizontal_alignment obsolete_text_halign;
  V5_vertical_alignment obsolete_leader_valign;
  V5_vertical_alignment obsolete_text_valign;
  bool local_5d;
  uint local_5c;
  undefined1 local_58 [4];
  uint i;
  ON_SimpleArray<bool> overrides;
  uint count;
  bool bOverrides;
  uint ignored_legacy_value;
  int ignored_text_style_index;
  LengthUnitSystem alt_dim_length_display_unit;
  LengthUnitSystem dim_length_display_unit;
  V5_TextDisplayMode obsolete_dimstyle_textalign;
  uint u;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_DimStyle *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,9);
  if (!bVar1) {
    return false;
  }
  this_local._7_1_ = false;
  bVar1 = ON_BinaryArchive::WriteModelComponentAttributes(file,&this->super_ON_ModelComponent,0x78);
  if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_extextension), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_extoffset), bVar1)) &&
     (((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_arrowsize), bVar1 &&
       (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_leaderarrowsize), bVar1)) &&
      ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_centermark), bVar1 &&
       ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_textgap), bVar1 &&
        (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_textheight), bVar1)))))))) {
    VVar2 = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(this);
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)VVar2);
    if ((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_angleformat), bVar1)) {
      model_unit_system = DimensionLengthDisplayUnit(this,0);
      model_unit_system_00 = AlternateDimensionLengthDisplayUnit(this,0);
      LVar8 = DimensionLengthDisplay(this);
      OVar3 = OBSOLETE_LengthFormatFromLengthDisplay(LVar8,model_unit_system);
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)OVar3);
      if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_angleresolution), bVar1)) &&
         (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_lengthresolution), bVar1)) {
        iVar9 = ON_BinaryArchive::Archive3dmVersion(file);
        if (iVar9 < 0x3c) {
          iVar9 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
          bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,TextStyle,iVar9);
        }
        else {
          bVar1 = ON_BinaryArchive::WriteInt(file,-0x7fffffff);
        }
        if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_lengthfactor), bVar1))
           && ((bVar1 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bAlternate & 1)), bVar1 &&
               (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_alternate_lengthfactor), bVar1)))
           ) {
          LVar8 = AlternateDimensionLengthDisplay(this);
          OVar3 = OBSOLETE_LengthFormatFromLengthDisplay(LVar8,model_unit_system_00);
          bVar1 = ON_BinaryArchive::WriteInt(file,(uint)OVar3);
          if ((bVar1) &&
             (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_alternate_lengthresolution), bVar1)) {
            ON_wString::IsValid(&this->m_prefix,true);
            bVar1 = ON_BinaryArchive::WriteString(file,&this->m_prefix);
            if (bVar1) {
              ON_wString::IsValid(&this->m_suffix,true);
              bVar1 = ON_BinaryArchive::WriteString(file,&this->m_suffix);
              if (bVar1) {
                ON_wString::IsValid(&this->m_alternate_prefix,true);
                bVar1 = ON_BinaryArchive::WriteString(file,&this->m_alternate_prefix);
                if (bVar1) {
                  ON_wString::IsValid(&this->m_alternate_suffix,true);
                  bVar1 = ON_BinaryArchive::WriteString(file,&this->m_alternate_suffix);
                  if ((((bVar1) &&
                       (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_dimextension), bVar1)) &&
                      (bVar1 = ON_BinaryArchive::WriteBool
                                         (file,(bool)(this->m_bSuppressExtension1 & 1)), bVar1)) &&
                     (bVar1 = ON_BinaryArchive::WriteBool
                                        (file,(bool)(this->m_bSuppressExtension2 & 1)), bVar1)) {
                    uuid = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
                    bVar1 = ON_BinaryArchive::WriteUuid(file,uuid);
                    if ((bVar1) &&
                       (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_field_override_parent_count)
                       , bVar1)) {
                      b = this->m_field_override_parent_count != 0;
                      bVar1 = ON_BinaryArchive::WriteBool(file,b);
                      if (bVar1) {
                        if (b) {
                          overrides.m_capacity = 0x73;
                          ON_SimpleArray<bool>::ON_SimpleArray
                                    ((ON_SimpleArray<bool> *)local_58,0x73);
                          for (local_5c = 0; local_5c < 0x73; local_5c = local_5c + 1) {
                            field_id = FieldFromUnsigned(local_5c);
                            local_5d = IsFieldOverride(this,field_id);
                            ON_SimpleArray<bool>::Append((ON_SimpleArray<bool> *)local_58,&local_5d)
                            ;
                          }
                          bVar1 = ON_BinaryArchive::WriteArray
                                            (file,(ON_SimpleArray<bool> *)local_58);
                          if (bVar1) {
                            _obsolete_leader_halign = 0;
                          }
                          else {
                            _obsolete_leader_halign = 2;
                          }
                          ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)local_58);
                          if (_obsolete_leader_halign != 0) goto LAB_005da902;
                        }
                        bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_tolerance_format);
                        if (((bVar1) &&
                            (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_tolerance_resolution),
                            bVar1)) &&
                           ((bVar1 = ON_BinaryArchive::WriteDouble
                                               (file,this->m_tolerance_upper_value), bVar1 &&
                            (((bVar1 = ON_BinaryArchive::WriteDouble
                                                 (file,this->m_tolerance_lower_value), bVar1 &&
                              (bVar1 = ON_BinaryArchive::WriteDouble
                                                 (file,this->m_tolerance_height_scale), bVar1)) &&
                             (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_baseline_spacing),
                             bVar1)))))) {
                          bVar1 = DrawTextMask(this);
                          bVar1 = ON_BinaryArchive::WriteBool(file,bVar1);
                          if (bVar1) {
                            MVar4 = MaskFillType(this);
                            bVar1 = ON_BinaryArchive::WriteInt(file,(uint)MVar4);
                            if (bVar1) {
                              local_74 = (anon_union_4_2_6147a14e_for_ON_Color_15)MaskColor(this);
                              bVar1 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_74);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                x = DimScale(this);
                                bVar1 = ON_BinaryArchive::WriteDouble(file,x);
                                if (((((bVar1) &&
                                      (bVar1 = ON_BinaryArchive::WriteInt
                                                         (file,this->m_dimscale_source), bVar1)) &&
                                     (((bVar1 = ON_BinaryArchive::WriteUuid
                                                          (file,&this->m_source_dimstyle), bVar1 &&
                                       ((bVar1 = ON_BinaryArchive::WriteChar
                                                           (file,this->m_ext_line_color_source),
                                        bVar1 && (bVar1 = ON_BinaryArchive::WriteChar
                                                                    (file,this->
                                                  m_dim_line_color_source), bVar1)))) &&
                                      (bVar1 = ON_BinaryArchive::WriteChar
                                                         (file,this->m_arrow_color_source), bVar1)))
                                     ) && (((((bVar1 = ON_BinaryArchive::WriteChar
                                                                 (file,this->m_text_color_source),
                                              bVar1 && (bVar1 = ON_BinaryArchive::WriteColor
                                                                          (file,&this->
                                                  m_ext_line_color), bVar1)) &&
                                             (bVar1 = ON_BinaryArchive::WriteColor
                                                                (file,&this->m_dim_line_color),
                                             bVar1)) &&
                                            (((bVar1 = ON_BinaryArchive::WriteColor
                                                                 (file,&this->m_arrow_color), bVar1
                                              && (bVar1 = ON_BinaryArchive::WriteColor
                                                                    (file,&this->m_text_color),
                                                 bVar1)) &&
                                             ((bVar1 = ON_BinaryArchive::WriteChar
                                                                 (file,this->
                                                  m_ext_line_plot_color_source), bVar1 &&
                                              ((bVar1 = ON_BinaryArchive::WriteChar
                                                                  (file,this->
                                                  m_dim_line_plot_color_source), bVar1 &&
                                               (bVar1 = ON_BinaryArchive::WriteChar
                                                                  (file,this->
                                                  m_arrow_plot_color_source), bVar1)))))))) &&
                                           ((bVar1 = ON_BinaryArchive::WriteChar
                                                               (file,this->m_text_plot_color_source)
                                            , bVar1 &&
                                            ((((((((bVar1 = ON_BinaryArchive::WriteColor
                                                                      (file,&this->
                                                  m_ext_line_plot_color), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteColor
                                                                     (file,&this->
                                                  m_dim_line_plot_color), bVar1)) &&
                                                  (bVar1 = ON_BinaryArchive::WriteColor
                                                                     (file,&this->m_arrow_plot_color
                                                                     ), bVar1)) &&
                                                 ((bVar1 = ON_BinaryArchive::WriteColor
                                                                     (file,&this->m_text_plot_color)
                                                  , bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteChar
                                                                     (file,this->
                                                  m_ext_line_plot_weight_source), bVar1)))) &&
                                                (bVar1 = ON_BinaryArchive::WriteChar
                                                                   (file,this->
                                                  m_dim_line_plot_weight_source), bVar1)) &&
                                               ((bVar1 = ON_BinaryArchive::WriteDouble
                                                                   (file,this->
                                                  m_ext_line_plot_weight_mm), bVar1 &&
                                                (bVar1 = ON_BinaryArchive::WriteDouble
                                                                   (file,this->
                                                  m_dim_line_plot_weight_mm), bVar1)))) &&
                                              ((bVar1 = ON_BinaryArchive::WriteDouble
                                                                  (file,this->m_fixed_extension_len)
                                               , bVar1 &&
                                               (((bVar1 = ON_BinaryArchive::WriteBool
                                                                    (file,(bool)(this->
                                                  m_fixed_extension_len_on & 1)), bVar1 &&
                                                 (bVar1 = ON_BinaryArchive::WriteDouble
                                                                    (file,this->m_text_rotation),
                                                 bVar1)) &&
                                                (bVar1 = ON_BinaryArchive::WriteInt
                                                                   (file,this->
                                                  m_alternate_tolerance_resolution), bVar1)))))) &&
                                             ((bVar1 = ON_BinaryArchive::WriteDouble
                                                                 (file,this->
                                                  m_tol_textheight_fraction), bVar1 &&
                                              (bVar1 = ON_BinaryArchive::WriteBool
                                                                 (file,(bool)(this->
                                                  m_suppress_arrow1 & 1)), bVar1)))))))))) &&
                                   ((((bVar1 = ON_BinaryArchive::WriteBool
                                                         (file,(bool)(this->m_suppress_arrow2 & 1)),
                                      bVar1 && (((((bVar1 = ON_BinaryArchive::WriteInt
                                                                      (file,this->m_textmove_leader)
                                                   , bVar1 &&
                                                   (bVar1 = ON_BinaryArchive::WriteInt
                                                                      (file,this->m_arclength_sym),
                                                   bVar1)) &&
                                                  ((bVar1 = ON_BinaryArchive::WriteDouble
                                                                      (file,this->
                                                  m_stack_textheight_fraction), bVar1 &&
                                                  (((bVar1 = ON_BinaryArchive::WriteInt
                                                                       (file,(uint)this->
                                                  m_stack_format), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteDouble
                                                                     (file,this->m_alt_round), bVar1
                                                  )) && (bVar1 = ON_BinaryArchive::WriteDouble
                                                                           (file,this->m_round),
                                                        bVar1)))))) &&
                                                 ((bVar1 = ON_BinaryArchive::WriteDouble
                                                                     (file,this->m_angular_round),
                                                  bVar1 && (bVar1 = ON_BinaryArchive::WriteInt
                                                                              (file,(uint)this->
                                                  m_alt_zero_suppress), bVar1)))) &&
                                                ((bVar1 = ON_BinaryArchive::WriteInt(file,0), bVar1
                                                 && (((bVar1 = ON_BinaryArchive::WriteInt
                                                                         (file,(uint)this->
                                                  m_zero_suppress), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_ang_zero_suppress), bVar1)) &&
                                                  ((bVar1 = ON_BinaryArchive::WriteBool
                                                                      (file,(bool)(this->m_alt_below
                                                                                  & 1)), bVar1 &&
                                                   ((((bVar1 = ON_BinaryArchive::WriteInt
                                                                         (file,this->m_arrow_type_1)
                                                      , bVar1 &&
                                                      (bVar1 = ON_BinaryArchive::WriteInt
                                                                         (file,this->m_arrow_type_2)
                                                      , bVar1)) &&
                                                     (bVar1 = ON_BinaryArchive::WriteInt
                                                                        (file,this->
                                                  m_leader_arrow_type), bVar1)) &&
                                                  ((bVar1 = ON_BinaryArchive::WriteUuid
                                                                      (file,&this->
                                                  m_arrow_block_id_1), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteUuid
                                                                     (file,&this->m_arrow_block_id_2
                                                                     ), bVar1)))))))))))))) &&
                                     (bVar1 = ON_BinaryArchive::WriteUuid
                                                        (file,&this->m_leader_arrow_block_id), bVar1
                                     )) && (bVar1 = ON_BinaryArchive::WriteInt(file,1), bVar1)))) {
                                  VVar5 = ON_INTERNAL_OBSOLETE::
                                          V5VerticalAlignmentFromV6VerticalAlignment
                                                    (this->m_text_vertical_alignment);
                                  bVar1 = ON_BinaryArchive::WriteInt(file,(uint)VVar5);
                                  if (bVar1) {
                                    VVar5 = ON_INTERNAL_OBSOLETE::
                                            V5VerticalAlignmentFromV6VerticalAlignment
                                                      (this->m_leader_text_vertical_alignment);
                                    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)VVar5);
                                    if (((bVar1) &&
                                        (bVar1 = ON_BinaryArchive::WriteInt
                                                           (file,(uint)this->
                                                  m_leader_content_angle_style), bVar1)) &&
                                       ((bVar1 = ON_BinaryArchive::WriteInt
                                                           (file,(uint)this->m_leader_curve_type),
                                        bVar1 && (((bVar1 = ON_BinaryArchive::WriteDouble
                                                                      (file,this->
                                                  m_leader_content_angle), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteBool
                                                                     (file,(bool)(this->
                                                  m_leader_has_landing & 1)), bVar1)) &&
                                                  (bVar1 = ON_BinaryArchive::WriteDouble
                                                                     (file,this->
                                                  m_leader_landing_length), bVar1)))))) {
                                      VVar6 = ON_INTERNAL_OBSOLETE::
                                              V5HorizontalAlignmentFromV6HorizontalAlignment
                                                        (this->m_text_horizontal_alignment);
                                      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)VVar6);
                                      if (bVar1) {
                                        VVar6 = ON_INTERNAL_OBSOLETE::
                                                V5HorizontalAlignmentFromV6HorizontalAlignment
                                                          (this->m_leader_text_horizontal_alignment)
                                        ;
                                        bVar1 = ON_BinaryArchive::WriteInt(file,(uint)VVar6);
                                        if (((bVar1) &&
                                            (bVar1 = ON_BinaryArchive::WriteBool
                                                               (file,(bool)(this->m_draw_forward & 1
                                                                           )), bVar1)) &&
                                           ((bVar1 = ON_BinaryArchive::WriteBool
                                                               (file,(bool)(this->m_signed_ordinate
                                                                           & 1)), bVar1 &&
                                            (bVar1 = ON_ScaleValue::Write(&this->m_scale_value,file)
                                            , bVar1)))) {
                                          LVar7 = UnitSystem(this);
                                          bVar1 = ON_BinaryArchive::WriteInt(file,(uint)LVar7);
                                          if ((((bVar1) &&
                                               (bVar1 = ON_Font::Write(&this->m_font_characteristics
                                                                       ,file), bVar1)) &&
                                              ((bVar1 = ON_TextMask::Write(&this->m_text_mask,file),
                                               bVar1 && (((bVar1 = ON_BinaryArchive::WriteInt
                                                                             (file,(uint)this->
                                                  m_dim_text_location), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_dimradial_text_location), bVar1)) &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_text_vertical_alignment), bVar1)))))) &&
                                             ((((((bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_text_horizontal_alignment), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_leader_text_vertical_alignment), bVar1)) &&
                                                 ((bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_leader_text_horizontal_alignment), bVar1 &&
                                                  ((bVar1 = ON_BinaryArchive::WriteInt
                                                                      (file,(uint)this->
                                                  m_text_orientation), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_leader_text_orientation), bVar1)))))) &&
                                                (bVar1 = ON_BinaryArchive::WriteInt
                                                                   (file,(uint)this->
                                                  m_dim_text_orientation), bVar1)) &&
                                               ((((bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_dimradial_text_orientation), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_dim_text_angle_style), bVar1)) &&
                                                 (bVar1 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)this->
                                                  m_dimradial_text_angle_style), bVar1)) &&
                                                ((bVar1 = ON_BinaryArchive::WriteBool
                                                                    (file,(bool)(this->
                                                  m_text_underlined & 1)), bVar1 &&
                                                 (bVar1 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)model_unit_system),
                                                 bVar1)))))) &&
                                              ((((bVar1 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)model_unit_system_00
                                                                    ), bVar1 &&
                                                 ((bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,this->
                                                  m_dimension_length_display), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,this->
                                                  m_alternate_dimension_length_display), bVar1))))
                                                && (bVar1 = ON_BinaryArchive::WriteInt
                                                                      (file,(uint)this->
                                                  m_centermark_style), bVar1)) &&
                                               ((((bVar1 = ON_BinaryArchive::WriteBool
                                                                     (file,(bool)(this->
                                                  m_bForceDimLine & 1)), bVar1 &&
                                                  (bVar1 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->m_TextFit),
                                                  bVar1)) &&
                                                 (bVar1 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)this->m_ArrowFit),
                                                 bVar1)) &&
                                                (bVar1 = ON_BinaryArchive::WriteInt
                                                                   (file,this->m_decimal_separator),
                                                bVar1)))))))) {
                                            this_local._7_1_ = true;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_005da902:
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
  if (!bVar1) {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_DimStyle::Write(
  ON_BinaryArchive& file // serialize definition to binary archive
  ) const
{
  if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 1, 9))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!file.WriteModelComponentAttributes(*this, ON_ModelComponent::Attributes::BinaryArchiveAttributes))
      break;

    unsigned int u;

    if (!file.WriteDouble(m_extextension)) break;
    if (!file.WriteDouble(m_extoffset)) break;
    if (!file.WriteDouble(m_arrowsize)) break;
    if (!file.WriteDouble(m_leaderarrowsize)) break;
    if (!file.WriteDouble(m_centermark)) break;
    if (!file.WriteDouble(m_textgap)) break;
    if (!file.WriteDouble(m_textheight)) break;


    ON_INTERNAL_OBSOLETE::V5_TextDisplayMode obsolete_dimstyle_textalign = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(*this);
    u = static_cast<unsigned int>(obsolete_dimstyle_textalign);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned char>(m_angleformat);
    if (!file.WriteInt(u)) break;

    // do not pass in model_sn - we want ON::LengthUnitSystem::None from ON_DimStyle::LengthDisplay::ModelUnits.
    const ON::LengthUnitSystem dim_length_display_unit = DimensionLengthDisplayUnit(0);
    const ON::LengthUnitSystem alt_dim_length_display_unit = AlternateDimensionLengthDisplayUnit(0);

    // write obsolete ON_DimStyle::OBSOLETE_LengthForma enum value
    u = static_cast<unsigned char>(
      ON_DimStyle::OBSOLETE_LengthFormatFromLengthDisplay(
        DimensionLengthDisplay(),
        dim_length_display_unit
      )
      );
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_angleresolution)) break;
    if (!file.WriteInt(m_lengthresolution)) break;

    if (file.Archive3dmVersion() >= 60)
    {
      int ignored_text_style_index = ON_UNSET_INT_INDEX;
      if (!file.WriteInt(ignored_text_style_index))
        break;
    }
    else
    {
      // ON_ModelComponent::Type::TextStyle, Index() are not  mistakes.
      // The code in Write3dmReferencedComponentIndex() will convert the dim style index to an approprate
      // value tht depends on the version ofr 3dm archive (<= V5 or >= V6) being saved.
      if (!file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::TextStyle, Index())) break;
    }

    if (!file.WriteDouble(m_lengthfactor)) break;
    if (!file.WriteBool(m_bAlternate)) break;
    if (!file.WriteDouble(m_alternate_lengthfactor)) break;

    // write alternate obsolete ON_DimStyle::OBSOLETE_LengthForma enum value
    u = static_cast<unsigned char>(
      ON_DimStyle::OBSOLETE_LengthFormatFromLengthDisplay(
        AlternateDimensionLengthDisplay(),
        alt_dim_length_display_unit
      )
      );
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_alternate_lengthresolution)) break;

    // The ON_wString::IsValid calls prevent corrupt strings from breaking file IO
    m_prefix.IsValid(true);
    if (!file.WriteString(m_prefix)) break;

    m_suffix.IsValid(true);
    if (!file.WriteString(m_suffix)) break;

    m_alternate_prefix.IsValid(true);
    if (!file.WriteString(m_alternate_prefix)) break;

    m_alternate_suffix.IsValid(true);
    if (!file.WriteString(m_alternate_suffix)) break;

    if (!file.WriteDouble(m_dimextension)) break;
    if (!file.WriteBool(m_bSuppressExtension1)) break;
    if (!file.WriteBool(m_bSuppressExtension2)) break;

    if (!file.WriteUuid(ParentId())) break;

    unsigned int ignored_legacy_value = m_field_override_parent_count;
    if (!file.WriteInt(ignored_legacy_value)) break;

    bool bOverrides = (m_field_override_parent_count > 0);
    if (!file.WriteBool(bOverrides)) break;
    if (bOverrides)
    {
      const unsigned int count = static_cast<unsigned int>(ON_DimStyle::field::Count);
      ON_SimpleArray<bool> overrides(count);
      for (unsigned int i = 0; i < count; i++)
      {
        overrides.Append(this->IsFieldOverride(ON_DimStyle::FieldFromUnsigned(i)));
      }
      if (!file.WriteArray(overrides)) break;
    }

    u = static_cast<unsigned char>(m_tolerance_format);
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_tolerance_resolution)) break;
    if (!file.WriteDouble(m_tolerance_upper_value)) break;   // or both upper and lower in symmetrical style
    if (!file.WriteDouble(m_tolerance_lower_value)) break;
    if (!file.WriteDouble(m_tolerance_height_scale)) break;  // relative to the main dimension text

    if (!file.WriteDouble(m_baseline_spacing)) break;

    // The text mask settings used to be a collection of several member variables
    // on ON_DimStyle and are now in an ON_TextMask class and a m_text_mask on ON_DimStyle.
    // These values are written here so the file format is not broken and 
    // older versions of Rhino can read newer file.
    if (!file.WriteBool(DrawTextMask())) break;
    u = (unsigned int)(static_cast<unsigned char>(MaskFillType()));
    if (!file.WriteInt(u)) break;
    if (!file.WriteColor(MaskColor())) break;

    if (!file.WriteDouble( DimScale() )) break;
    if (!file.WriteInt(m_dimscale_source)) break;

    if (!file.WriteUuid(m_source_dimstyle)) break;
    if (!file.WriteChar(m_ext_line_color_source)) break;
    if (!file.WriteChar(m_dim_line_color_source)) break;
    if (!file.WriteChar(m_arrow_color_source)) break;
    if (!file.WriteChar(m_text_color_source)) break;
    if (!file.WriteColor(m_ext_line_color)) break;
    if (!file.WriteColor(m_dim_line_color)) break;
    if (!file.WriteColor(m_arrow_color)) break;
    if (!file.WriteColor(m_text_color)) break;
    if (!file.WriteChar(m_ext_line_plot_color_source)) break;
    if (!file.WriteChar(m_dim_line_plot_color_source)) break;
    if (!file.WriteChar(m_arrow_plot_color_source)) break;
    if (!file.WriteChar(m_text_plot_color_source)) break;
    if (!file.WriteColor(m_ext_line_plot_color)) break;
    if (!file.WriteColor(m_dim_line_plot_color)) break;
    if (!file.WriteColor(m_arrow_plot_color)) break;
    if (!file.WriteColor(m_text_plot_color)) break;
    if (!file.WriteChar(m_ext_line_plot_weight_source)) break;
    if (!file.WriteChar(m_dim_line_plot_weight_source)) break;
    if (!file.WriteDouble(m_ext_line_plot_weight_mm)) break;
    if (!file.WriteDouble(m_dim_line_plot_weight_mm)) break;

    if (!file.WriteDouble(m_fixed_extension_len)) break;
    if (!file.WriteBool(m_fixed_extension_len_on)) break;

    if (!file.WriteDouble(m_text_rotation)) break;
    if (!file.WriteInt(m_alternate_tolerance_resolution)) break;
    if (!file.WriteDouble(m_tol_textheight_fraction)) break;

    if (!file.WriteBool(m_suppress_arrow1)) break;
    if (!file.WriteBool(m_suppress_arrow2)) break;
    if (!file.WriteInt(m_textmove_leader)) break;
    if (!file.WriteInt(m_arclength_sym)) break;
    if (!file.WriteDouble(m_stack_textheight_fraction)) break;

    u = static_cast<unsigned char>(m_stack_format);
    if (!file.WriteInt(u)) break;
    if (!file.WriteDouble(m_alt_round)) break;
    if (!file.WriteDouble(m_round)) break;
    if (!file.WriteDouble(m_angular_round)) break;

    u = static_cast<unsigned char>(m_alt_zero_suppress);
    if (!file.WriteInt(u)) break;

    u = 0;// OBSOLETE; static_cast<unsigned char>(m_tol_zero_suppress);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned char>(m_zero_suppress);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned char>(m_ang_zero_suppress);
    if (!file.WriteInt(u)) break;


    if (!file.WriteBool(m_alt_below)) break;

    // true: display alternate text after main text
    u = static_cast<unsigned int>(m_arrow_type_1);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_arrow_type_2);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_leader_arrow_type);
    if (!file.WriteInt(u)) break;

    // Dale Lear April 8, 2016 
    //  working on http://mcneel.myjetbrains.com/youtrack/issue/RH-31796
    //
    //   It appears that when this code got changed from something that
    //   wrote 16 bytes to something that wrote 3 uuids, the chunk's
    //   minor version number was not increased and no provision was
    //   made to read files that had the the 16 bytes.
    //
    //   The file "layer_test.3dm" written by Windows Rhino WIP built on October 21, 2015
    //   is an example. See the comment in ON_DimStyle::Read() for more details
    //   and a fix that allows us to read the earlier files.
    //
    if (!file.WriteUuid(m_arrow_block_id_1)) break;
    if (!file.WriteUuid(m_arrow_block_id_2)) break;
    if (!file.WriteUuid(m_leader_arrow_block_id)) break;

    // End of version chunk 1.0 fields (in most cases - see comment above)

    // June 10, 2016
    // http://mcneel.myjetbrains.com/youtrack/issue/RH-33795
    // chunk version 1.1 information added

    // BEGIN chunk version 1.1 information

    u = 1; // OBSOLETE ON_DimStyle::leader_content_type::Text
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_vertical_alignment obsolete_text_valign = ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV6VerticalAlignment(m_text_vertical_alignment);
    u = static_cast<unsigned int>(obsolete_text_valign);
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_vertical_alignment obsolete_leader_valign = ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV6VerticalAlignment(m_leader_text_vertical_alignment);
    u = static_cast<unsigned int>(obsolete_leader_valign);
    if (!file.WriteInt(u)) break;


    u = static_cast<unsigned int>(m_leader_content_angle_style);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_curve_type);
    if (!file.WriteInt(u)) break;

    if (!file.WriteDouble(m_leader_content_angle)) break;
    if (!file.WriteBool(m_leader_has_landing)) break;
    if (!file.WriteDouble(m_leader_landing_length)) break;

    ON_INTERNAL_OBSOLETE::V5_horizontal_alignment obsolete_text_halign = ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV6HorizontalAlignment(m_text_horizontal_alignment);
    u = static_cast<unsigned int>(obsolete_text_halign);
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_horizontal_alignment obsolete_leader_halign = ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV6HorizontalAlignment(m_leader_text_horizontal_alignment);
    u = static_cast<unsigned int>(obsolete_leader_halign);
    if (!file.WriteInt(u)) break;

    if (!file.WriteBool(m_draw_forward)) break;
    if (!file.WriteBool(m_signed_ordinate)) break;

    if (!m_scale_value.Write(file)) break;

    u = static_cast<unsigned int>(this->UnitSystem());
    if (!file.WriteInt(u)) break;

    // END chunk version 1.1 information

    // August 2016 added m_font_characteristics to archive.
    if (!m_font_characteristics.Write(file)) break;

    // END chunk version 1.2 information

    // October 2016 added m_text_mask
    if (!m_text_mask.Write(file)) break;

    // END chunk version 1.3 information

    // Feb 2017 added enum values
    u = static_cast<unsigned int>(m_dim_text_location);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_location);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_vertical_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_horizontal_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_vertical_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_horizontal_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dim_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dim_text_angle_style);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_angle_style);
    if (!file.WriteInt(u)) break;

    if (!file.WriteBool(m_text_underlined)) break;

    // END chunk version 1.4 information

    // June 16, 2017 chunk 1.5 information
    // added m_dimension_unitsystem and m_alt_dimension_unitsystem 
    u = static_cast<unsigned int>(dim_length_display_unit);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(alt_dim_length_display_unit);
    if (!file.WriteInt(u)) break;

    // END chunk version 1.5 information

    // June 29, 2017 chunk 1.6 added 
    // m_dimension_length_display and m_alternate_dimension_length_display
    u = static_cast<unsigned int>(m_dimension_length_display);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_alternate_dimension_length_display);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.6 information

    u = static_cast<unsigned int>(m_centermark_style);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.7 information

    if (!file.WriteBool(m_bForceDimLine)) break;

    u = static_cast<unsigned int>(m_TextFit);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_ArrowFit);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.8 information

    u = static_cast<unsigned int>(m_decimal_separator);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.9 information

    rc = true;
    break;
  }
  if (!file.EndWrite3dmChunk())
    rc = false;

  return rc;
}